

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

int __thiscall libchars::editor::edit(editor *this,string *str,size_t timeout_s)

{
  int iVar1;
  undefined1 local_4078 [8];
  edit_object O_tmp;
  
  edit_object::edit_object((edit_object *)local_4078,MODE_STRING,str);
  iVar1 = edit(this,(edit_object *)local_4078,timeout_s);
  if ((iVar1 == 0) && (O_tmp.buffer._16376_8_ != 0)) {
    std::__cxx11::string::assign((char *)str,(ulong)&O_tmp);
  }
  edit_object::~edit_object((edit_object *)local_4078);
  return iVar1;
}

Assistant:

int editor::edit(std::string &str, size_t timeout_s)
    {
        edit_object O_tmp(MODE_STRING,str);
        int r = edit(O_tmp, timeout_s);
        if (r == 0 && O_tmp.length() > 0 && O_tmp.data() != NULL)
            str.assign(O_tmp.data(),O_tmp.length());
        return r;
    }